

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::_constructor(CmdLine *this)

{
  CmdLineOutput *this_00;
  HelpVisitor *this_01;
  Arg *pAVar1;
  VersionVisitor *this_02;
  Visitor *this_03;
  allocator local_191;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  Arg *local_130;
  SwitchArg *ignore;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [32];
  Arg *local_b0;
  SwitchArg *vers;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [32];
  Arg *local_30;
  SwitchArg *help;
  HelpVisitor *local_18;
  Visitor *v;
  CmdLine *this_local;
  
  v = (Visitor *)this;
  this_00 = (CmdLineOutput *)operator_new(8);
  StdOutput::StdOutput((StdOutput *)this_00);
  this->_output = this_00;
  Arg::setDelimiter(this->_delimiter);
  if ((this->_helpAndVersion & 1U) != 0) {
    this_01 = (HelpVisitor *)operator_new(0x18);
    HelpVisitor::HelpVisitor(this_01,&this->super_CmdLineInterface,&this->_output);
    local_18 = this_01;
    pAVar1 = (Arg *)operator_new(0xa8);
    vers._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"h",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"help",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,"Displays usage information and exits.",(allocator *)((long)&vers + 7));
    SwitchArg::SwitchArg
              ((SwitchArg *)pAVar1,(string *)local_50,(string *)local_78,(string *)local_a0,false,
               &local_18->super_Visitor);
    vers._6_1_ = 0;
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&vers + 7));
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_30 = pAVar1;
    (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar1);
    deleteOnExit(this,local_30);
    deleteOnExit(this,&local_18->super_Visitor);
    this_02 = (VersionVisitor *)operator_new(0x18);
    VersionVisitor::VersionVisitor(this_02,&this->super_CmdLineInterface,&this->_output);
    local_18 = (HelpVisitor *)this_02;
    pAVar1 = (Arg *)operator_new(0xa8);
    ignore._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"version",&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_120,"Displays version information and exits.",(allocator *)((long)&ignore + 7))
    ;
    SwitchArg::SwitchArg
              ((SwitchArg *)pAVar1,(string *)local_d0,(string *)local_f8,(string *)local_120,false,
               &local_18->super_Visitor);
    ignore._6_1_ = 0;
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ignore + 7));
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    local_b0 = pAVar1;
    (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar1);
    deleteOnExit(this,local_b0);
    deleteOnExit(this,&local_18->super_Visitor);
  }
  this_03 = (Visitor *)operator_new(8);
  IgnoreRestVisitor::IgnoreRestVisitor((IgnoreRestVisitor *)this_03);
  local_18 = (HelpVisitor *)this_03;
  pAVar1 = (Arg *)operator_new(0xa8);
  Arg::flagStartString_abi_cxx11_();
  Arg::ignoreNameString_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_190,"Ignores the rest of the labeled arguments following this flag.",&local_191);
  SwitchArg::SwitchArg
            ((SwitchArg *)pAVar1,local_150,local_170,(string *)local_190,false,
             &local_18->super_Visitor);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_150);
  local_130 = pAVar1;
  (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])(this,pAVar1);
  deleteOnExit(this,local_130);
  deleteOnExit(this,&local_18->super_Visitor);
  return;
}

Assistant:

inline void CmdLine::_constructor()
{
	_output = new StdOutput;

	Arg::setDelimiter( _delimiter );

	Visitor* v;

	if ( _helpAndVersion )
	{
		v = new HelpVisitor( this, &_output );
		SwitchArg* help = new SwitchArg("h","help",
		                      "Displays usage information and exits.",
		                      false, v);
		add( help );
		deleteOnExit(help);
		deleteOnExit(v);

		v = new VersionVisitor( this, &_output );
		SwitchArg* vers = new SwitchArg("","version",
		                      "Displays version information and exits.",
		                      false, v);
		add( vers );
		deleteOnExit(vers);
		deleteOnExit(v);
	}

	v = new IgnoreRestVisitor();
	SwitchArg* ignore  = new SwitchArg(Arg::flagStartString(),
	          Arg::ignoreNameString(),
	          "Ignores the rest of the labeled arguments following this flag.",
	          false, v);
	add( ignore );
	deleteOnExit(ignore);
	deleteOnExit(v);
}